

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O2

void __thiscall QSqlField::setDefaultValue(QSqlField *this,QVariant *value)

{
  QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach(&this->d);
  QVariant::operator=(&((this->d).d.ptr)->def,value);
  return;
}

Assistant:

void QSqlField::setDefaultValue(const QVariant &value)
{
    detach();
    d->def = value;
}